

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::DefinePropertiesHelperForGenericObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  undefined8 uVar1;
  code *pcVar2;
  PropertyRecord *pPVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  Recycler *pRVar7;
  JavascriptString *propertyString;
  undefined4 *puVar8;
  DescriptorMap *pDVar9;
  ulong uVar10;
  Var propertySpec;
  PropertyRecord *pPVar11;
  size_t count;
  size_t count_00;
  long lVar12;
  AllocFuncType AllocFunc;
  char *pcVar13;
  ulong uVar14;
  undefined1 auStack_f8 [8];
  JavascriptStaticEnumerator enumerator;
  undefined1 local_a8 [8];
  TrackAllocData data;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  DescriptorMap *descriptors;
  PropertyId propId;
  
  auStack_f8 = (undefined1  [8])0x0;
  enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
  enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
  enumerator.propertyEnumerator.enumeratedCount = 0;
  enumerator.propertyEnumerator.flags = None;
  enumerator.propertyEnumerator._37_3_ = 0;
  enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
  enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
  enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
  JavascriptStaticEnumerator::Clear
            ((JavascriptStaticEnumerator *)auStack_f8,None,(ScriptContext *)0x0);
  iVar5 = (*(props->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])
                    (props,(JavascriptStaticEnumerator *)auStack_f8,2,scriptContext,0);
  if (iVar5 != 0) {
    EnterPinnedScope(&propertyRecord);
    local_a8 = (undefined1  [8])
               &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
                ::DescriptorMap::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x10;
    data.count = (size_t)anon_var_dwarf_7b17b92;
    data.filename._0_4_ = 0x775;
    pRVar7 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_a8);
    AllocFunc = 0x10;
    propertyRecord =
         (PropertyRecord *)
         Memory::
         AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                   (pRVar7,0x10,count);
    uVar14 = 0;
    propertyString =
         JavascriptStaticEnumerator::MoveAndGetNext
                   ((JavascriptStaticEnumerator *)auStack_f8,(PropertyId *)((long)&descriptors + 4),
                    (PropertyAttributes *)0x0);
    if (propertyString != (JavascriptString *)0x0) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar14 = 0;
      do {
        if (descriptors._4_4_ == -1) {
          ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_48);
          descriptors._4_4_ = local_48->pid;
        }
        else {
          (*(propertyString->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])
                    (propertyString,&local_48,0);
        }
        pDVar9 = (DescriptorMap *)propertyRecord;
        if (uVar14 == AllocFunc) {
          AllocFunc = uVar14 * 2;
          if ((long)uVar14 < 0) {
            AllocFunc = 0xffffffffffffffff;
          }
          local_a8 = (undefined1  [8])
                     &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
                      ::DescriptorMap::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_7b17b92;
          data.filename._0_4_ = 0x78d;
          data.plusSize = AllocFunc;
          pRVar7 = Memory::Recycler::TrackAllocInfo
                             (scriptContext->recycler,(TrackAllocData *)local_a8);
          pDVar9 = Memory::
                   AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                             (pRVar7,AllocFunc,count_00);
          if (uVar14 != 0) {
            lVar12 = 0;
            uVar10 = uVar14;
            do {
              pPVar11 = propertyRecord;
              pcVar13 = (char *)((long)&(pDVar9->propRecord).ptr + lVar12);
              uVar1 = *(undefined8 *)
                       ((long)&(propertyRecord->super_FinalizableObject).
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar12);
              data._32_8_ = uVar10;
              Memory::Recycler::WBSetBit(pcVar13);
              *(undefined8 *)((long)&(pDVar9->propRecord).ptr + lVar12) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
              pcVar13 = (char *)((long)&(pDVar9->descriptor).Value.ptr + lVar12);
              uVar1 = *(undefined8 *)((long)&pPVar11->pid + lVar12);
              Memory::Recycler::WBSetBit(pcVar13);
              *(undefined8 *)((long)&(pDVar9->descriptor).Value.ptr + lVar12) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
              pcVar13 = (char *)((long)&(pDVar9->descriptor).Getter.ptr + lVar12);
              uVar1 = *(undefined8 *)(&pPVar11->isNumeric + lVar12);
              Memory::Recycler::WBSetBit(pcVar13);
              *(undefined8 *)((long)&(pDVar9->descriptor).Getter.ptr + lVar12) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
              pcVar13 = (char *)((long)&(pDVar9->descriptor).Setter.ptr + lVar12);
              uVar1 = *(undefined8 *)
                       ((long)&pPVar11[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                               _vptr_IRecyclerVisitedObject + lVar12);
              Memory::Recycler::WBSetBit(pcVar13);
              *(undefined8 *)((long)&(pDVar9->descriptor).Setter.ptr + lVar12) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
              pcVar13 = (char *)((long)&(pDVar9->descriptor).originalVar.ptr + lVar12);
              uVar1 = *(undefined8 *)((long)&pPVar11[1].pid + lVar12);
              Memory::Recycler::WBSetBit(pcVar13);
              *(undefined8 *)((long)&(pDVar9->descriptor).originalVar.ptr + lVar12) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
              *(undefined2 *)(&(pDVar9->descriptor).Configurable + lVar12) =
                   *(undefined2 *)
                    ((long)&pPVar11[2].super_FinalizableObject.super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject + lVar12);
              *(undefined8 *)(&(pDVar9->descriptor).writableSpecified + lVar12) =
                   *(undefined8 *)(&pPVar11[1].isNumeric + lVar12);
              pcVar13 = (char *)((long)&(pDVar9->originalVar).ptr + lVar12);
              uVar1 = *(undefined8 *)((long)&pPVar11[2].pid + lVar12);
              Memory::Recycler::WBSetBit(pcVar13);
              *(undefined8 *)((long)&(pDVar9->originalVar).ptr + lVar12) = uVar1;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
              lVar12 = lVar12 + 0x40;
              uVar10 = data._32_8_ - 1;
            } while (uVar10 != 0);
          }
        }
        propertyRecord = (PropertyRecord *)pDVar9;
        propertySpec = JavascriptOperators::GetPropertyNoCache
                                 (props,descriptors._4_4_,scriptContext);
        if (AllocFunc <= uVar14) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x798,"(descCount < descSize)","descCount < descSize");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        lVar12 = uVar14 * 0x40;
        BVar6 = JavascriptOperators::ToPropertyDescriptor
                          (propertySpec,(PropertyDescriptor *)((long)propertyRecord + lVar12 + 8),
                           scriptContext);
        if (BVar6 == 0) {
          pPVar11 = ScriptContext::GetPropertyName(scriptContext,descriptors._4_4_);
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2c,(PCWSTR)(pPVar11 + 1));
        }
        pcVar13 = (char *)((long)propertyRecord + lVar12 + 0x38);
        Memory::Recycler::WBSetBit(pcVar13);
        *(Var *)pcVar13 = propertySpec;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
        if (DAT_015d346b == '\x01') {
          ModifyGetterSetterFuncName
                    (local_48,(PropertyDescriptor *)((long)propertyRecord + lVar12 + 8),
                     scriptContext);
        }
        pPVar3 = propertyRecord;
        pPVar11 = local_48;
        pcVar13 = (char *)((long)propertyRecord + lVar12);
        Memory::Recycler::WBSetBit(pcVar13);
        *(PropertyRecord **)((long)pPVar3 + lVar12) = pPVar11;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar13);
        uVar14 = uVar14 + 1;
        propertyString =
             JavascriptStaticEnumerator::MoveAndGetNext
                       ((JavascriptStaticEnumerator *)auStack_f8,
                        (PropertyId *)((long)&descriptors + 4),(PropertyAttributes *)0x0);
      } while (propertyString != (JavascriptString *)0x0);
    }
    if (uVar14 != 0) {
      lVar12 = 8;
      do {
        DefineOwnPropertyHelper
                  (object,*(PropertyId *)(*(long *)((long)propertyRecord + lVar12 + -8) + 8),
                   (PropertyDescriptor *)
                   ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + lVar12),scriptContext,true);
        lVar12 = lVar12 + 0x40;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    LeavePinnedScope();
  }
  return object;
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForGenericObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    size_t descSize = 16;
    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
        Field(Var) originalVar;
    };

    JavascriptStaticEnumerator enumerator;
    if (!props->GetEnumerator(&enumerator, EnumeratorFlags::EnumSymbols, scriptContext))
    {
        return object;
    }

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

    PropertyId propId;
    PropertyRecord const * propertyRecord;
    JavascriptString* propertyName = nullptr;

    //enumerate through each property of properties and fetch the property descriptor
    while ((propertyName = enumerator.MoveAndGetNext(propId)) != NULL)
    {
        if (propId == Constants::NoProperty) //try current property id query first
        {
            scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
            propId = propertyRecord->GetPropertyId();
        }
        else
        {
            propertyName->GetPropertyRecord(&propertyRecord);
        }

        if (descCount == descSize)
        {
            //reallocate - consider linked list of DescriptorMap if the descSize is too high
            descSize = AllocSizeMath::Mul(descCount, 2);
            __analysis_assume(descSize == descCount * 2);
            DescriptorMap *temp = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

            for (size_t i = 0; i < descCount; i++)
            {
                temp[i] = descriptors[i];
            }
            descriptors = temp;
        }

        Var tempVar = JavascriptOperators::GetPropertyNoCache(props, propId, scriptContext);

        AnalysisAssert(descCount < descSize);
        if (!JavascriptOperators::ToPropertyDescriptor(tempVar, &descriptors[descCount].descriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propId)->GetBuffer());
        }
        // In proxy, we need to get back the original ToPropertDescriptor var in [[defineProperty]] trap.
        descriptors[descCount].originalVar = tempVar;

        if (CONFIG_FLAG(UseFullName))
        {
            ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
        }

        descriptors[descCount].propRecord = propertyRecord;

        descCount++;
    }

    //Once all the property descriptors are in place set each property descriptor to the object
    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    return object;
}